

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O3

int magic_negation(monst *mon)

{
  xchar xVar1;
  obj *poVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  
  poVar2 = uarm;
  if (mon != &youmonst) {
    poVar2 = which_armor(mon,1);
  }
  if (poVar2 == (obj *)0x0) {
    uVar4 = 0;
    goto LAB_001d36d4;
  }
  bVar3 = 0;
  if ('\0' < objects[poVar2->otyp].oc_oc2) {
    bVar3 = objects[poVar2->otyp].oc_oc2;
  }
  uVar5 = poVar2->owt;
  uVar4 = (uint)bVar3;
  if (uVar5 < 200) goto LAB_001d36d4;
  xVar1 = mon_skill_level(0x28,mon);
  if (xVar1 < '\x04') {
    if (xVar1 == '\x03') {
      bVar7 = uVar5 < 300;
      uVar6 = 2;
      goto LAB_001d36c2;
    }
    uVar6 = (uint)(xVar1 == '\x02');
  }
  else {
    bVar7 = uVar5 < 400;
    uVar6 = 3;
LAB_001d36c2:
    if (bVar7) {
      uVar6 = uVar5 / 100 - 1;
    }
  }
  if (bVar3 < uVar6) {
    uVar4 = uVar6;
  }
LAB_001d36d4:
  poVar2 = uarmc;
  if (mon != &youmonst) {
    poVar2 = which_armor(mon,2);
  }
  if ((poVar2 != (obj *)0x0) && ((int)uVar4 <= (int)objects[poVar2->otyp].oc_oc2)) {
    uVar4 = (int)objects[poVar2->otyp].oc_oc2;
  }
  poVar2 = uarmh;
  if (mon != &youmonst) {
    poVar2 = which_armor(mon,4);
  }
  if ((poVar2 != (obj *)0x0) && ((int)uVar4 <= (int)objects[poVar2->otyp].oc_oc2)) {
    uVar4 = (int)objects[poVar2->otyp].oc_oc2;
  }
  poVar2 = uarmu;
  if (mon != &youmonst) {
    poVar2 = which_armor(mon,0x40);
  }
  if ((poVar2 != (obj *)0x0) && ((int)uVar4 <= (int)objects[poVar2->otyp].oc_oc2)) {
    uVar4 = (int)objects[poVar2->otyp].oc_oc2;
  }
  poVar2 = uarmg;
  if (mon != &youmonst) {
    poVar2 = which_armor(mon,0x10);
  }
  if ((poVar2 != (obj *)0x0) && ((int)uVar4 <= (int)objects[poVar2->otyp].oc_oc2)) {
    uVar4 = (int)objects[poVar2->otyp].oc_oc2;
  }
  poVar2 = uarmf;
  if (mon != &youmonst) {
    poVar2 = which_armor(mon,0x20);
  }
  if ((poVar2 != (obj *)0x0) && ((int)uVar4 <= (int)objects[poVar2->otyp].oc_oc2)) {
    uVar4 = (int)objects[poVar2->otyp].oc_oc2;
  }
  poVar2 = uarms;
  if (mon != &youmonst) {
    poVar2 = which_armor(mon,8);
  }
  if (poVar2 != (obj *)0x0) {
    uVar5 = (int)objects[poVar2->otyp].oc_oc2;
    if ((int)objects[poVar2->otyp].oc_oc2 < (int)uVar4) {
      uVar5 = uVar4;
    }
    uVar6 = (objects[poVar2->otyp].oc_oc1 + 1) - (uint)(poVar2->owt < 0x33);
    xVar1 = mon_skill_level(0x29,mon);
    if (xVar1 < '\x04') {
      if (xVar1 == '\x03') {
        bVar8 = SBORROW4(uVar6,2);
        bVar7 = (int)(uVar6 - 2) < 0;
        uVar4 = 2;
      }
      else {
        uVar4 = (uint)(xVar1 == '\x02');
        bVar8 = SBORROW4(uVar6,uVar4);
        bVar7 = (int)(uVar6 - uVar4) < 0;
      }
    }
    else {
      bVar8 = SBORROW4(uVar6,3);
      bVar7 = (int)(uVar6 - 3) < 0;
      uVar4 = 3;
    }
    if (bVar8 != bVar7) {
      uVar4 = uVar6;
    }
    if ((int)uVar4 < (int)uVar5) {
      uVar4 = uVar5;
    }
  }
  uVar5 = uVar4;
  if (((mon != &youmonst) && (poVar2 = which_armor(mon,0x100000), poVar2 != (obj *)0x0)) &&
     (uVar5 = (int)objects[poVar2->otyp].oc_oc2, (int)objects[poVar2->otyp].oc_oc2 < (int)uVar4)) {
    uVar5 = uVar4;
  }
  return uVar5;
}

Assistant:

int magic_negation(struct monst *mon)
{
	struct obj *armor;
	int armpro = 0;
	xchar sklev;
	int bonus;

	armor = (mon == &youmonst) ? uarm : which_armor(mon, W_ARM);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	/*
	 * Bonus magic cancellation for body armor skill,
	 * MC1/2/3 for basic/skilled/expert.
	 */
	if (armor && armor->owt >= 200) {
	    bonus = armor->owt / 100 - 1;
	    sklev = mon_skill_level(P_BODY_ARMOR, mon);
	    bonus = min(bonus,
			sklev >= P_EXPERT ? 3 :
			sklev == P_SKILLED ? 2 :
			sklev == P_BASIC ? 1 : 0);
	    if (armpro < bonus)
		armpro = bonus;
	}

	armor = (mon == &youmonst) ? uarmc : which_armor(mon, W_ARMC);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	armor = (mon == &youmonst) ? uarmh : which_armor(mon, W_ARMH);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;

	/* armor types for shirt, gloves, and shoes don't currently
	   provide any magic cancellation but we might as well be complete */
	armor = (mon == &youmonst) ? uarmu : which_armor(mon, W_ARMU);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	armor = (mon == &youmonst) ? uarmg : which_armor(mon, W_ARMG);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	armor = (mon == &youmonst) ? uarmf : which_armor(mon, W_ARMF);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;

	armor = (mon == &youmonst) ? uarms : which_armor(mon, W_ARMS);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	/*
	 * Bonus magic cancellation for shield skill,
	 * MC1/2/3 for basic/skilled/expert.
	 */
	if (armor) {
	    bonus = objects[armor->otyp].a_ac + (armor->owt > 50 ? 1 : 0);
	    sklev = mon_skill_level(P_SHIELD, mon);
	    bonus = min(bonus,
			sklev >= P_EXPERT ? 3 :
			sklev == P_SKILLED ? 2 :
			sklev == P_BASIC ? 1 : 0);
	    if (armpro < bonus)
		armpro = bonus;
	}

	/* this one is really a stretch... */
	armor = (mon == &youmonst) ? 0 : which_armor(mon, W_SADDLE);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;

	return armpro;
}